

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenVertexNormalsProcess.cpp
# Opt level: O1

bool __thiscall
Assimp::GenVertexNormalsProcess::GenMeshVertexNormals
          (GenVertexNormalsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiFace *paVar1;
  uint uVar2;
  uint uVar3;
  aiVector3D *paVar4;
  uint *puVar5;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  uint uVar6;
  aiVector3D *paVar7;
  ulong uVar8;
  Base **ppBVar9;
  Logger *this_00;
  _func_int **pp_Var10;
  ulong uVar11;
  ulong uVar12;
  SpatialSort *this_01;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  vector<bool,_std::allocator<bool>_> abHad;
  SpatialSort _vertexFinder;
  ai_real local_e0;
  allocator_type local_da;
  bool local_d9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  vector<bool,_std::allocator<bool>_> local_90;
  undefined1 local_68 [16];
  SpatialSort local_58;
  
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (this->force_ != true) {
      return false;
    }
    operator_delete__(pMesh->mNormals);
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    return false;
  }
  uVar6 = pMesh->mNumVertices;
  paVar7 = (aiVector3D *)operator_new__((ulong)uVar6 * 0xc);
  if (uVar6 != 0) {
    memset(paVar7,0,(((ulong)uVar6 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mNormals = paVar7;
  if (pMesh->mNumFaces != 0) {
    uVar12 = 0;
    do {
      paVar1 = pMesh->mFaces + uVar12;
      uVar6 = pMesh->mFaces[uVar12].mNumIndices;
      if (uVar6 < 3) {
        if (paVar1->mNumIndices != 0) {
          uVar8 = 0;
          do {
            paVar4 = pMesh->mNormals;
            uVar6 = paVar1->mIndices[uVar8];
            paVar7 = paVar4 + uVar6;
            paVar7->x = NAN;
            paVar7->y = NAN;
            paVar4[uVar6].z = NAN;
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumIndices);
        }
      }
      else {
        paVar7 = pMesh->mVertices;
        puVar5 = paVar1->mIndices;
        uVar3 = *puVar5;
        uVar2 = puVar5[1];
        uVar6 = puVar5[uVar6 - 1];
        fVar13 = paVar7[uVar2].x - paVar7[uVar3].x;
        fVar14 = paVar7[uVar2].y - paVar7[uVar3].y;
        fVar17 = paVar7[uVar2].z - paVar7[uVar3].z;
        fVar15 = paVar7[uVar6].x - paVar7[uVar3].x;
        fVar16 = paVar7[uVar6].y - paVar7[uVar3].y;
        fVar19 = paVar7[uVar6].z - paVar7[uVar3].z;
        fVar18 = fVar14 * fVar19 - fVar16 * fVar17;
        fVar19 = fVar17 * fVar15 - fVar19 * fVar13;
        fVar13 = fVar16 * fVar13 - fVar15 * fVar14;
        fVar14 = fVar13 * fVar13 + fVar18 * fVar18 + fVar19 * fVar19;
        if (fVar14 < 0.0) {
          local_a8 = ZEXT416((uint)fVar18);
          local_b8 = ZEXT416((uint)fVar19);
          fVar14 = sqrtf(fVar14);
          fVar18 = (float)local_a8._0_4_;
          fVar19 = (float)local_b8._0_4_;
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        if (0.0 < fVar14) {
          fVar14 = 1.0 / fVar14;
          fVar18 = fVar18 * fVar14;
          fVar19 = fVar19 * fVar14;
          fVar13 = fVar13 * fVar14;
        }
        if (paVar1->mNumIndices != 0) {
          uVar8 = 0;
          do {
            paVar4 = pMesh->mNormals;
            uVar6 = paVar1->mIndices[uVar8];
            paVar7 = paVar4 + uVar6;
            paVar7->x = fVar18;
            paVar7->y = fVar19;
            paVar4[uVar6].z = fVar13;
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumIndices);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < pMesh->mNumFaces);
  }
  SpatialSort::SpatialSort(&local_58);
  list = &((this->super_BaseProcess).shared)->pmap;
  local_e0 = 1e-05;
  if (list != (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
               *)0x0) {
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ppBVar9 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                        (list,"$Spat",(Base **)&local_90);
    if (*ppBVar9 == (Base *)0x0) {
      pp_Var10 = (_func_int **)0x0;
    }
    else {
      pp_Var10 = (*ppBVar9)[1]._vptr_Base;
    }
    if (pp_Var10 != (_func_int **)0x0) {
      this_01 = (SpatialSort *)(*pp_Var10 + (ulong)meshIndex * 0x30);
      local_e0 = *(ai_real *)(*pp_Var10 + (ulong)meshIndex * 0x30 + 0x28);
      goto LAB_0015412c;
    }
  }
  this_01 = (SpatialSort *)0x0;
LAB_0015412c:
  if (this_01 == (SpatialSort *)0x0) {
    this_01 = &local_58;
    SpatialSort::Fill(this_01,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
    local_e0 = ComputePositionEpsilon(pMesh);
  }
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = (ulong)pMesh->mNumVertices;
  paVar7 = (aiVector3D *)operator_new__(uVar12 * 0xc);
  if (uVar12 != 0) {
    memset(paVar7,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  if (3.054326 <= this->configMaxAngle) {
    local_d9 = false;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_90,uVar12,&local_d9,&local_da);
    if (pMesh->mNumVertices != 0) {
      uVar12 = 0;
      do {
        if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
          SpatialSort::FindPositions(this_01,pMesh->mVertices + uVar12,local_e0,&local_d8);
          if ((long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start == 0) {
            fVar19 = 0.0;
            fVar13 = 0.0;
            fVar18 = 0.0;
          }
          else {
            paVar4 = pMesh->mNormals;
            fVar18 = 0.0;
            uVar8 = 0;
            fVar13 = 0.0;
            fVar19 = 0.0;
            do {
              uVar6 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar8];
              fVar14 = paVar4[uVar6].x;
              if ((~(uint)fVar14 & 0x7f800000) != 0 || ((uint)fVar14 & 0x7fffff) == 0) {
                fVar19 = fVar19 + fVar14;
                fVar13 = fVar13 + paVar4[uVar6].y;
                fVar18 = fVar18 + paVar4[uVar6].z;
              }
              uVar8 = uVar8 + 1;
            } while ((uVar8 & 0xffffffff) <
                     (ulong)((long)local_d8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
          }
          fVar14 = fVar18 * fVar18 + fVar19 * fVar19 + fVar13 * fVar13;
          if (fVar14 < 0.0) {
            local_a8 = ZEXT416((uint)fVar19);
            local_b8 = ZEXT416((uint)fVar13);
            local_68 = ZEXT416((uint)fVar18);
            fVar14 = sqrtf(fVar14);
            fVar13 = (float)local_b8._0_4_;
            fVar18 = (float)local_68._0_4_;
            fVar19 = (float)local_a8._0_4_;
          }
          else {
            fVar14 = SQRT(fVar14);
          }
          fVar15 = 1.0 / fVar14;
          if (0.0 < fVar14) {
            fVar19 = fVar19 * fVar15;
            fVar13 = fVar13 * fVar15;
          }
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar6 = 1;
            uVar8 = 0;
            do {
              uVar3 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar8];
              paVar7[uVar3].x = fVar19;
              paVar7[uVar3].y = fVar13;
              paVar7[uVar3].z =
                   (float)(~-(uint)(0.0 < fVar14) & (uint)fVar18 |
                          (uint)(fVar15 * fVar18) & -(uint)(0.0 < fVar14));
              local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] =
                   local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] |
                   1L << ((byte)uVar3 & 0x3f);
              uVar8 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar8 < (ulong)((long)local_d8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_d8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2));
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < pMesh->mNumVertices);
    }
    if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
  }
  else {
    fVar13 = cosf(this->configMaxAngle);
    if (pMesh->mNumVertices != 0) {
      uVar12 = 0;
      local_bc = fVar13;
      do {
        SpatialSort::FindPositions(this_01,pMesh->mVertices + uVar12,local_e0,&local_d8);
        if ((long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          fVar19 = 0.0;
          fVar18 = 0.0;
          fVar13 = 0.0;
        }
        else {
          paVar4 = pMesh->mNormals;
          fVar13 = 0.0;
          uVar8 = 0;
          fVar18 = 0.0;
          fVar19 = 0.0;
          do {
            uVar11 = (ulong)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8];
            fVar14 = paVar4[uVar11].x;
            if ((~(uint)fVar14 & 0x7f800000) != 0 || ((uint)fVar14 & 0x7fffff) == 0) {
              if ((uVar12 == uVar11) ||
                 (local_bc <=
                  paVar4[uVar11].z * paVar4[uVar12].z +
                  fVar14 * paVar4[uVar12].x + paVar4[uVar12].y * paVar4[uVar11].y)) {
                fVar13 = fVar13 + fVar14;
                fVar18 = fVar18 + paVar4[uVar11].y;
                fVar19 = fVar19 + paVar4[uVar11].z;
              }
            }
            uVar8 = uVar8 + 1;
          } while ((uVar8 & 0xffffffff) <
                   (ulong)((long)local_d8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        fVar14 = fVar19 * fVar19 + fVar13 * fVar13 + fVar18 * fVar18;
        if (fVar14 < 0.0) {
          local_a8 = ZEXT416((uint)fVar13);
          local_b8 = ZEXT416((uint)fVar18);
          local_68 = ZEXT416((uint)fVar19);
          fVar14 = sqrtf(fVar14);
          fVar13 = (float)local_a8._0_4_;
          fVar18 = (float)local_b8._0_4_;
          fVar19 = (float)local_68._0_4_;
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        fVar15 = 1.0 / fVar14;
        if (0.0 < fVar14) {
          fVar13 = fVar13 * fVar15;
          fVar18 = fVar18 * fVar15;
        }
        paVar7[uVar12].x = fVar13;
        paVar7[uVar12].y = fVar18;
        paVar7[uVar12].z =
             (float)(~-(uint)(0.0 < fVar14) & (uint)fVar19 |
                    (uint)(fVar15 * fVar19) & -(uint)(0.0 < fVar14));
        uVar12 = uVar12 + 1;
      } while (uVar12 < pMesh->mNumVertices);
    }
  }
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mNormals);
  }
  pMesh->mNormals = paVar7;
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  SpatialSort::~SpatialSort(&local_58);
  return true;
}

Assistant:

bool GenVertexNormalsProcess::GenMeshVertexNormals (aiMesh* pMesh, unsigned int meshIndex)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // Allocate the array to hold the output normals
    const float qnan = std::numeric_limits<ai_real>::quiet_NaN();
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    // Compute per-face normals but store them per-vertex
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // either a point or a line -> no normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }

            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }

    // Set up a SpatialSort to quickly find all vertices close to a given position
    // check whether we can reuse the SpatialSort of a previous step.
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    ai_real posEpsilon = ai_real( 1e-5 );
    if (shared) {
        std::vector<std::pair<SpatialSort,ai_real> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,ai_real>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;
        }
    }
    if (!vertexFinder)  {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;
    aiVector3D* pcNew = new aiVector3D[pMesh->mNumVertices];

    if (configMaxAngle >= AI_DEG_TO_RAD( 175.f ))   {
        // There is no angle limit. Thus all vertices with positions close
        // to each other will receive the same vertex normal. This allows us
        // to optimize the whole algorithm a little bit ...
        std::vector<bool> abHad(pMesh->mNumVertices,false);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            if (abHad[i]) {
                continue;
            }

            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i], posEpsilon, verticesFound);

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                const aiVector3D& v = pMesh->mNormals[verticesFound[a]];
                if (is_not_qnan(v.x))pcNor += v;
            }
            pcNor.NormalizeSafe();

            // Write the smoothed normal back to all affected normals
            for (unsigned int a = 0; a < verticesFound.size(); ++a)
            {
                unsigned int vidx = verticesFound[a];
                pcNew[vidx] = pcNor;
                abHad[vidx] = true;
            }
        }
    }
    // Slower code path if a smooth angle is set. There are many ways to achieve
    // the effect, this one is the most straightforward one.
    else    {
        const ai_real fLimit = std::cos(configMaxAngle);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i] , posEpsilon, verticesFound);

            aiVector3D vr = pMesh->mNormals[i];

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                aiVector3D v = pMesh->mNormals[verticesFound[a]];

                // Check whether the angle between the two normals is not too large.
                // Skip the angle check on our own normal to avoid false negatives
                // (v*v is not guaranteed to be 1.0 for all unit vectors v)
                if (is_not_qnan(v.x) && (verticesFound[a] == i || (v * vr >= fLimit)))
                    pcNor += v;
            }
            pcNew[i] = pcNor.NormalizeSafe();
        }
    }

    delete[] pMesh->mNormals;
    pMesh->mNormals = pcNew;

    return true;
}